

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

string * __thiscall ghc::net::uri::str_abi_cxx11_(string *__return_storage_ptr__,uri *this)

{
  ulong uVar1;
  ostream *poVar2;
  string *psVar3;
  undefined1 local_1d0 [8];
  string authTemp;
  stringstream local_1a0 [8];
  stringstream result;
  ostream local_190;
  uri *local_18;
  uri *this_local;
  
  local_18 = this;
  this_local = (uri *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<(&local_190,(string *)&this->_scheme);
    std::operator<<(poVar2,":");
  }
  authority_abi_cxx11_((string *)local_1d0,this);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<(&local_190,"//");
    std::operator<<(poVar2,(string *)local_1d0);
  }
  std::operator<<(&local_190,(string *)&this->_path);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<(&local_190,"?");
    std::operator<<(poVar2,(string *)&this->_query);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<(&local_190,"#");
    psVar3 = fragment_abi_cxx11_(this);
    std::operator<<(poVar2,(string *)psVar3);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE std::string uri::str() const
{
    std::stringstream result;
    if (!_scheme.empty()) {
        result << _scheme << ":";
    }
    std::string authTemp = authority();
    if (!authTemp.empty()) {
        result << "//" << authTemp;
    }
    result << _path;
    if (!_query.empty()) {
        result << "?" << _query;
    }
    if (!_fragment.empty()) {
        result << "#" << fragment();
    }
    return result.str();
}